

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ortho_rh_no.c
# Opt level: O2

void glmc_ortho_aabb_pz_rh_no(vec3 *box,float padding,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  
  fVar5 = box[1][2] + padding;
  fVar2 = (*box)[2] - padding;
  fVar1 = -1.0 / (fVar5 - fVar2);
  fVar6 = (float)*(undefined8 *)box[1];
  fVar7 = (float)((ulong)*(undefined8 *)box[1] >> 0x20);
  fVar3 = (float)*(undefined8 *)*box;
  fVar4 = (float)((ulong)*(undefined8 *)*box >> 0x20);
  auVar9._4_4_ = fVar7 - fVar4;
  auVar9._0_4_ = fVar6 - fVar3;
  auVar9._8_8_ = 0;
  auVar9 = divps(_DAT_00120190,auVar9);
  fVar8 = auVar9._0_4_;
  fVar10 = auVar9._4_4_;
  *(float *)((long)dest + 0) = 0.0;
  *(float *)((long)dest + 4) = 0.0;
  *(float *)((long)dest + 8) = 0.0;
  *(float *)((long)dest + 0xc) = 0.0;
  *(float *)((long)(dest + 1) + 0) = 0.0;
  *(float *)((long)(dest + 1) + 4) = 0.0;
  *(float *)((long)(dest + 1) + 8) = 0.0;
  *(float *)((long)(dest + 1) + 0xc) = 0.0;
  *(float *)((long)(dest + 2) + 0) = 0.0;
  *(float *)((long)(dest + 2) + 4) = 0.0;
  *(float *)((long)(dest + 2) + 8) = 0.0;
  *(float *)((long)(dest + 2) + 0xc) = 0.0;
  (*dest)[0] = fVar8 + fVar8;
  dest[1][1] = fVar10 + fVar10;
  dest[2][2] = fVar1 + fVar1;
  *(ulong *)dest[3] = CONCAT44(-(fVar4 + fVar7) * fVar10,-(fVar3 + fVar6) * fVar8);
  dest[3][2] = (-fVar5 - fVar2) * fVar1;
  dest[3][3] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_ortho_aabb_pz_rh_no(vec3 box[2], float padding, mat4 dest) {
  glm_ortho_aabb_pz_rh_no(box, padding, dest);
}